

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

void setMPIRequest(IceTCommRequest icet_request,MPI_Request mpi_request)

{
  MPI_Request mpi_request_local;
  IceTCommRequest icet_request_local;
  
  if (icet_request == (IceTCommRequest)0x0) {
    icetRaiseDiagnostic("Cannot set MPI request in null request.",0xffffffff,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x6e);
  }
  else if (icet_request->magic_number == 0xd7168b00) {
    *(MPI_Request *)icet_request->internals = mpi_request;
  }
  else {
    icetRaiseDiagnostic("Request object is not from the MPI communicator.",0xffffffff,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x74);
  }
  return;
}

Assistant:

static void setMPIRequest(IceTCommRequest icet_request, MPI_Request mpi_request)
{
    if (icet_request == ICET_COMM_REQUEST_NULL) {
        icetRaiseError("Cannot set MPI request in null request.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    if (icet_request->magic_number != ICET_MPI_REQUEST_MAGIC_NUMBER) {
        icetRaiseError("Request object is not from the MPI communicator.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    (((IceTMPICommRequestInternals)icet_request->internals)->request)
        = mpi_request;
}